

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_flush_cookies(Curl_easy *data,int cleanup)

{
  CookieInfo *cookies;
  byte *__filename;
  curl_slist *list;
  Cookie *co;
  FILE *__stream;
  char *pcVar1;
  uint uVar2;
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup != 0) && (list = (data->change).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->change).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  }
  else {
    if ((data->change).cookielist != (curl_slist *)0x0) {
      Curl_cookie_loadfiles(data);
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    cookies = data->cookies;
    if ((cookies != (CookieInfo *)0x0) && (cookies->numcookies != 0)) {
      __filename = (byte *)(data->set).str[5];
      remove_expired(cookies);
      uVar2 = *__filename - 0x2d;
      if (uVar2 == 0) {
        uVar2 = (uint)__filename[1];
      }
      __stream = _stdout;
      if ((uVar2 == 0) || (__stream = fopen64((char *)__filename,"w"), __stream != (FILE *)0x0)) {
        fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
              ,__stream);
        for (co = cookies->cookies; co != (Cookie *)0x0; co = co->next) {
          if (co->domain != (char *)0x0) {
            pcVar1 = get_netscape_format(co);
            if (pcVar1 == (char *)0x0) {
              curl_mfprintf((FILE *)__stream,"#\n# Fatal libcurl error\n");
              if (uVar2 != 0) {
                fclose(__stream);
              }
              goto LAB_0010e6ab;
            }
            curl_mfprintf((FILE *)__stream,"%s\n",pcVar1);
            (*Curl_cfree)(pcVar1);
          }
        }
        if (uVar2 != 0) {
          fclose(__stream);
        }
      }
      else {
LAB_0010e6ab:
        Curl_infof(data,"WARNING: failed to save cookies in %s\n",(data->set).str[5]);
      }
    }
  }
  if (cleanup != 0) {
    if ((data->share == (Curl_share *)0x0) || (data->cookies != data->share->cookies)) {
      Curl_cookie_cleanup(data->cookies);
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, int cleanup)
{
  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->change.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    if(cookie_output(data->cookies, data->set.str[STRING_COOKIEJAR]))
      infof(data, "WARNING: failed to save cookies in %s\n",
            data->set.str[STRING_COOKIEJAR]);
  }
  else {
    if(cleanup && data->change.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->change.cookielist); /* clean up list */
      data->change.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}